

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O2

_Bool ts_range_array_intersects
                (TSRangeArray *self,uint start_index,uint32_t start_byte,uint32_t end_byte)

{
  long lVar1;
  uint i;
  ulong uVar2;
  long lVar3;
  
  uVar2 = (ulong)start_index - 1;
  lVar1 = (ulong)start_index * 0x18 + 0x14;
  do {
    lVar3 = lVar1;
    uVar2 = uVar2 + 1;
    if (self->size <= uVar2) {
      return false;
    }
    lVar1 = lVar3 + 0x18;
  } while (*(uint *)((long)&(self->contents->start_point).row + lVar3) <= start_byte);
  return *(uint *)((long)&self->contents[-1].end_byte + lVar3) < end_byte;
}

Assistant:

bool ts_range_array_intersects(const TSRangeArray *self, unsigned start_index,
                               uint32_t start_byte, uint32_t end_byte) {
  for (unsigned i = start_index; i < self->size; i++) {
    TSRange *range = &self->contents[i];
    if (range->end_byte > start_byte) {
      if (range->start_byte >= end_byte) break;
      return true;
    }
  }
  return false;
}